

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

cgltf_size cgltf_num_components(cgltf_type type)

{
  cgltf_size cStack_10;
  cgltf_type type_local;
  
  switch(type) {
  case cgltf_type_invalid:
  case cgltf_type_scalar:
  default:
    cStack_10 = 1;
    break;
  case cgltf_type_vec2:
    cStack_10 = 2;
    break;
  case cgltf_type_vec3:
    cStack_10 = 3;
    break;
  case cgltf_type_vec4:
    cStack_10 = 4;
    break;
  case cgltf_type_mat2:
    cStack_10 = 4;
    break;
  case cgltf_type_mat3:
    cStack_10 = 9;
    break;
  case cgltf_type_mat4:
    cStack_10 = 0x10;
  }
  return cStack_10;
}

Assistant:

cgltf_size cgltf_num_components(cgltf_type type) {
	switch (type)
	{
	case cgltf_type_vec2:
		return 2;
	case cgltf_type_vec3:
		return 3;
	case cgltf_type_vec4:
		return 4;
	case cgltf_type_mat2:
		return 4;
	case cgltf_type_mat3:
		return 9;
	case cgltf_type_mat4:
		return 16;
	case cgltf_type_invalid:
	case cgltf_type_scalar:
	default:
		return 1;
	}
}